

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_pkey.c
# Opt level: O0

EVP_PKEY *
pem_read_bio_key(BIO *bp,EVP_PKEY **x,pem_password_cb *cb,void *u,OSSL_LIB_CTX *libctx,char *propq,
                int selection)

{
  int iVar1;
  int iVar2;
  long lVar3;
  BIO_METHOD *type;
  code *in_RDX;
  BIO *in_RDI;
  BIO *in_R9;
  ossl_passphrase_data_st pwdata;
  int pos;
  BIO *new_bio;
  EVP_PKEY *ret;
  char *in_stack_000003e0;
  OSSL_LIB_CTX *in_stack_000003e8;
  void *in_stack_000003f0;
  pem_password_cb *in_stack_000003f8;
  EVP_PKEY **in_stack_00000400;
  BIO *in_stack_00000408;
  int in_stack_00000420;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  pem_password_cb *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffa0;
  OSSL_LIB_CTX *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  BIO *b;
  int selection_00;
  BIO *local_10;
  EVP_PKEY *local_8;
  
  local_8 = (EVP_PKEY *)0x0;
  b = (BIO *)0x0;
  memset(&stack0xffffffffffffff80,0,0x30);
  lVar3 = BIO_ctrl(in_RDI,0x85,0,(void *)0x0);
  iVar1 = (int)lVar3;
  local_10 = in_RDI;
  if (iVar1 < 0) {
    type = BIO_f_readbuffer();
    b = BIO_new((BIO_METHOD *)type);
    if (b == (BIO *)0x0) {
      return (EVP_PKEY *)0x0;
    }
    local_10 = BIO_push(b,in_RDI);
    lVar3 = BIO_ctrl(local_10,0x85,0,(void *)0x0);
    iVar1 = (int)lVar3;
  }
  if (in_RDX == (code *)0x0) {
    in_RDX = PEM_def_callback;
  }
  selection_00 = (int)in_RDX;
  iVar2 = ossl_pw_set_pem_password_cb
                    ((ossl_passphrase_data_st *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if ((iVar2 != 0) &&
     (iVar2 = ossl_pw_enable_passphrase_caching((ossl_passphrase_data_st *)&stack0xffffffffffffff80)
     , iVar2 != 0)) {
    ERR_set_mark();
    local_8 = pem_read_bio_key_decoder
                        (in_R9,(EVP_PKEY **)local_8,(pem_password_cb *)b,
                         (void *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
                         ,in_stack_ffffffffffffffa0,selection_00);
    if ((local_8 == (EVP_PKEY *)0x0) &&
       ((lVar3 = BIO_ctrl(local_10,0x80,(long)iVar1,(void *)0x0), (int)lVar3 < 0 ||
        (local_8 = pem_read_bio_key_legacy
                             (in_stack_00000408,in_stack_00000400,in_stack_000003f8,
                              in_stack_000003f0,in_stack_000003e8,in_stack_000003e0,
                              in_stack_00000420), local_8 == (EVP_PKEY *)0x0)))) {
      ERR_clear_last_mark();
    }
    else {
      ERR_pop_to_mark();
    }
  }
  ossl_pw_clear_passphrase_data((ossl_passphrase_data_st *)0x2a7b78);
  if (b != (BIO *)0x0) {
    BIO_pop(b);
    BIO_free(b);
  }
  return local_8;
}

Assistant:

static EVP_PKEY *pem_read_bio_key(BIO *bp, EVP_PKEY **x,
                                  pem_password_cb *cb, void *u,
                                  OSSL_LIB_CTX *libctx,
                                  const char *propq,
                                  int selection)
{
    EVP_PKEY *ret = NULL;
    BIO *new_bio = NULL;
    int pos;
    struct ossl_passphrase_data_st pwdata = { 0 };

    if ((pos = BIO_tell(bp)) < 0) {
        new_bio = BIO_new(BIO_f_readbuffer());
        if (new_bio == NULL)
            return NULL;
        bp = BIO_push(new_bio, bp);
        pos = BIO_tell(bp);
    }

    if (cb == NULL)
        cb = PEM_def_callback;

    if (!ossl_pw_set_pem_password_cb(&pwdata, cb, u)
        || !ossl_pw_enable_passphrase_caching(&pwdata))
        goto err;

    ERR_set_mark();
    ret = pem_read_bio_key_decoder(bp, x, ossl_pw_pem_password, &pwdata,
                                   libctx, propq, selection);
    if (ret == NULL
        && (BIO_seek(bp, pos) < 0
            || (ret = pem_read_bio_key_legacy(bp, x,
                                              ossl_pw_pem_password, &pwdata,
                                              libctx, propq,
                                              selection)) == NULL))
        ERR_clear_last_mark();
    else
        ERR_pop_to_mark();

 err:
    ossl_pw_clear_passphrase_data(&pwdata);
    if (new_bio != NULL) {
        BIO_pop(new_bio);
        BIO_free(new_bio);
    }
    return ret;
}